

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void __thiscall DataRefs::SetViewType(DataRefs *this,XPViewTypes vt)

{
  logLevelTy lVar1;
  XPViewTypes in_ESI;
  long in_RDI;
  mapViewTypesTy *mvt;
  mapViewTypesTy *__end1;
  mapViewTypesTy *__begin1;
  mapViewTypesTy (*__range1) [12];
  mapViewTypesTy *local_20;
  
  local_20 = MAP_VIEW_TYPES;
  while( true ) {
    if (local_20 == (mapViewTypesTy *)&GET_VAR) {
      lVar1 = GetLogLevel(&dataRefs);
      if ((int)lVar1 < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x46d,"SetViewType",logWARN,"Didn\'t find the requested view type %d",(ulong)in_ESI)
        ;
      }
      return;
    }
    if (local_20->e == in_ESI) break;
    local_20 = local_20 + 1;
  }
  XPLMCommandOnce(*(undefined8 *)(in_RDI + 0x468 + (long)local_20->cr * 8));
  return;
}

Assistant:

void DataRefs::SetViewType(XPViewTypes vt)
{
    // search the view in the map of view types
    for (const mapViewTypesTy& mvt: MAP_VIEW_TYPES)
        if (mvt.e == vt) {
            XPLMCommandOnce(cmdXP[mvt.cr]);
            return;
        }
    LOG_MSG(logWARN, "Didn't find the requested view type %d", int(vt));
}